

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_36::NetworkAddressHttpClient::~NetworkAddressHttpClient
          (NetworkAddressHttpClient *this)

{
  NetworkAddressHttpClient *this_local;
  
  std::
  deque<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
  ::~deque(&this->availableClients);
  Promise<void>::~Promise(&this->timeoutTask);
  Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::~Maybe(&this->drainedFulfiller);
  Own<kj::NetworkAddress,_std::nullptr_t>::~Own(&this->address);
  return;
}

Assistant:

NetworkAddressHttpClient(kj::Timer& timer, const HttpHeaderTable& responseHeaderTable,
                           kj::Own<kj::NetworkAddress> address, HttpClientSettings settings)
      : timer(timer),
        responseHeaderTable(responseHeaderTable),
        address(kj::mv(address)),
        settings(kj::mv(settings)) {}